

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::UpdateMouseMovingWindowNewFrame(void)

{
  ImGuiViewportFlags *pIVar1;
  ImGuiID *pIVar2;
  ImGuiID *pIVar3;
  ImVec2 IVar4;
  ImVec2 IVar5;
  ImGuiID IVar6;
  ImGuiWindow_conflict *pIVar7;
  ImGuiContext_conflict1 *pIVar8;
  _Bool _Var9;
  ImGuiViewportP_conflict1 *pIVar10;
  ImGuiContext_conflict1 *g;
  bool bVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  ImVec2 pos;
  ImVec2 local_30;
  ImVec2 local_28;
  undefined8 uStack_20;
  
  pIVar8 = GImGui;
  pIVar7 = GImGui->MovingWindow;
  if (pIVar7 == (ImGuiWindow_conflict *)0x0) {
    if (GImGui->ActiveIdWindow == (ImGuiWindow_conflict *)0x0) {
      return;
    }
    IVar6 = GImGui->ActiveIdWindow->MoveId;
    if (IVar6 != GImGui->ActiveId) {
      return;
    }
    GImGui->ActiveIdIsAlive = IVar6;
    if (pIVar8->ActiveIdPreviousFrame == IVar6) {
      pIVar8->ActiveIdPreviousFrameIsAlive = true;
    }
    if ((pIVar8->IO).MouseDown[0] != false) {
      return;
    }
LAB_001c2f4e:
    SetActiveID(0,(ImGuiWindow_conflict *)0x0);
    return;
  }
  pIVar2 = &GImGui->ActiveId;
  pIVar3 = &GImGui->ActiveIdPreviousFrame;
  GImGui->ActiveIdIsAlive = *pIVar2;
  if (*pIVar3 == *pIVar2) {
    pIVar8->ActiveIdPreviousFrameIsAlive = true;
  }
  pIVar7 = pIVar7->RootWindowDockTree;
  if (pIVar7 == (ImGuiWindow_conflict *)0x0) {
    __assert_fail("g.MovingWindow && g.MovingWindow->RootWindowDockTree",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0xe63,"void ImGui::UpdateMouseMovingWindowNewFrame()");
  }
  bVar11 = true;
  if (pIVar7->WasActive == true) {
    bVar11 = pIVar7->Viewport == (ImGuiViewportP_conflict1 *)0x0;
  }
  if (((pIVar8->IO).MouseDown[0] != true) ||
     (_Var9 = IsMousePosValid(&(pIVar8->IO).MousePos), (~_Var9 & 1U) != 0 || bVar11)) {
    if (!bVar11) {
      if ((pIVar8->ConfigFlagsCurrFrame & 0x400) != 0) {
        UpdateTryMergeWindowIntoHostViewport(pIVar7,pIVar8->MouseViewport);
      }
      if ((GImGui->DragDropActive == true) && (GImGui->DragDropAcceptIdPrev != 0)) {
        pIVar10 = pIVar7->Viewport;
      }
      else {
        pIVar10 = pIVar7->Viewport;
        pIVar8->MouseViewport = pIVar10;
      }
      pIVar1 = &(pIVar10->super_ImGuiViewport).Flags;
      *(byte *)pIVar1 = (byte)*pIVar1 & 0x7f;
    }
    pIVar8->MovingWindow = (ImGuiWindow_conflict *)0x0;
    goto LAB_001c2f4e;
  }
  IVar4 = (pIVar8->IO).MousePos;
  fVar13 = IVar4.x - (pIVar8->ActiveIdClickOffset).x;
  fVar14 = IVar4.y - (pIVar8->ActiveIdClickOffset).y;
  local_30.y = fVar14;
  local_30.x = fVar13;
  fVar12 = (pIVar7->Pos).x;
  if ((fVar12 == fVar13) && (!NAN(fVar12) && !NAN(fVar13))) {
    fVar12 = (pIVar7->Pos).y;
    if ((fVar12 == fVar14) && (!NAN(fVar12) && !NAN(fVar14))) goto LAB_001c302a;
  }
  local_28.y = fVar14;
  local_28.x = fVar13;
  uStack_20 = 0;
  if (((pIVar7->Flags & 0x100) == 0) && (GImGui->SettingsDirtyTimer <= 0.0)) {
    GImGui->SettingsDirtyTimer = (GImGui->IO).IniSavingRate;
  }
  SetWindowPos(pIVar7,&local_30,1);
  if (pIVar7->ViewportOwned == true) {
    (pIVar7->Viewport->super_ImGuiViewport).Pos = local_28;
    pIVar10 = pIVar7->Viewport;
    IVar4 = (pIVar10->super_ImGuiViewport).Pos;
    IVar5 = (pIVar10->super_ImGuiViewport).Size;
    fVar14 = (pIVar10->WorkOffsetMin).x;
    fVar15 = (pIVar10->WorkOffsetMin).y;
    fVar12 = (IVar5.x - fVar14) + (pIVar10->WorkOffsetMax).x;
    fVar13 = (IVar5.y - fVar15) + (pIVar10->WorkOffsetMax).y;
    (pIVar10->super_ImGuiViewport).WorkPos.x = IVar4.x + fVar14;
    (pIVar10->super_ImGuiViewport).WorkPos.y = IVar4.y + fVar15;
    (pIVar10->super_ImGuiViewport).WorkSize.x = (float)(-(uint)(0.0 < fVar12) & (uint)fVar12);
    (pIVar10->super_ImGuiViewport).WorkSize.y = (float)(-(uint)(0.0 < fVar13) & (uint)fVar13);
  }
LAB_001c302a:
  FocusWindow(pIVar8->MovingWindow);
  return;
}

Assistant:

void ImGui::UpdateMouseMovingWindowNewFrame()
{
    ImGuiContext& g = *GImGui;
    if (g.MovingWindow != NULL)
    {
        // We actually want to move the root window. g.MovingWindow == window we clicked on (could be a child window).
        // We track it to preserve Focus and so that generally ActiveIdWindow == MovingWindow and ActiveId == MovingWindow->MoveId for consistency.
        KeepAliveID(g.ActiveId);
        IM_ASSERT(g.MovingWindow && g.MovingWindow->RootWindowDockTree);
        ImGuiWindow* moving_window = g.MovingWindow->RootWindowDockTree;

        // When a window stop being submitted while being dragged, it may will its viewport until next Begin()
        const bool window_disappared = (!moving_window->WasActive || moving_window->Viewport == NULL);
        if (g.IO.MouseDown[0] && IsMousePosValid(&g.IO.MousePos) && !window_disappared)
        {
            ImVec2 pos = g.IO.MousePos - g.ActiveIdClickOffset;
            if (moving_window->Pos.x != pos.x || moving_window->Pos.y != pos.y)
            {
                MarkIniSettingsDirty(moving_window);
                SetWindowPos(moving_window, pos, ImGuiCond_Always);
                if (moving_window->ViewportOwned) // Synchronize viewport immediately because some overlays may relies on clipping rectangle before we Begin() into the window.
                {
                    moving_window->Viewport->Pos = pos;
                    moving_window->Viewport->UpdateWorkRect();
                }
            }
            FocusWindow(g.MovingWindow);
        }
        else
        {
            if (!window_disappared)
            {
                // Try to merge the window back into the main viewport.
                // This works because MouseViewport should be != MovingWindow->Viewport on release (as per code in UpdateViewports)
                if (g.ConfigFlagsCurrFrame & ImGuiConfigFlags_ViewportsEnable)
                    UpdateTryMergeWindowIntoHostViewport(moving_window, g.MouseViewport);

                // Restore the mouse viewport so that we don't hover the viewport _under_ the moved window during the frame we released the mouse button.
                if (!IsDragDropPayloadBeingAccepted())
                    g.MouseViewport = moving_window->Viewport;

                // Clear the NoInput window flag set by the Viewport system
                moving_window->Viewport->Flags &= ~ImGuiViewportFlags_NoInputs; // FIXME-VIEWPORT: Test engine managed to crash here because Viewport was NULL.
            }

            g.MovingWindow = NULL;
            ClearActiveID();
        }
    }
    else
    {
        // When clicking/dragging from a window that has the _NoMove flag, we still set the ActiveId in order to prevent hovering others.
        if (g.ActiveIdWindow && g.ActiveIdWindow->MoveId == g.ActiveId)
        {
            KeepAliveID(g.ActiveId);
            if (!g.IO.MouseDown[0])
                ClearActiveID();
        }
    }
}